

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> * __thiscall
sqlite_orm::internal::
table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::get_table_info(table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                 *this)

{
  bool bVar1;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *pvVar2;
  pointer ptVar3;
  __normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
  in_RSI;
  anon_class_8_1_1ff670bf_for__M_pred in_RDI;
  __normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
  it;
  value_type *columnName;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compositeKeyColumnNames;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *res;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *in_stack_ffffffffffffff48
  ;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *this_00;
  __normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
  __first;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *in_stack_ffffffffffffff80
  ;
  table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
  local_60;
  reference local_58;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [2];
  byte local_11;
  
  local_11 = 0;
  __first._M_current = (table_info *)in_RDI.columnName;
  std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::vector
            ((vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)0x21227e);
  std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::reserve
            (in_stack_ffffffffffffff80,(size_type)__first._M_current);
  table_t<relive::KeyValue,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string),sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string)>>
  ::
  for_each_column<sqlite_orm::internal::table_t<relive::KeyValue,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string),sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string)>>::get_table_info()const::_lambda(auto:1&)_1_>
            ((table_t<relive::KeyValue,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::KeyValue::*)()_const,_void_(relive::KeyValue::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
              *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (anon_class_8_1_ba1d7400 *)in_stack_ffffffffffffff48);
  composite_key_columns_names(in_stack_ffffffffffffff88);
  local_50 = (vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)0x0;
  while (this_00 = local_50,
        pvVar2 = (vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(local_48), this_00 < pvVar2) {
    local_58 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_48,(size_type)local_50);
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::begin
              (in_stack_ffffffffffffff48);
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::end
              (in_stack_ffffffffffffff48);
    local_60 = std::
               find_if<__gnu_cxx::__normal_iterator<sqlite_orm::table_info*,std::vector<sqlite_orm::table_info,std::allocator<sqlite_orm::table_info>>>,sqlite_orm::internal::table_t<relive::KeyValue,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string),sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::KeyValue,std::__cxx11::string,std::__cxx11::string_const&(relive::KeyValue::*)()const,void(relive::KeyValue::*)(std::__cxx11::string)>>::get_table_info()const::_lambda(sqlite_orm::table_info_const&)_1_>
                         (__first,in_RSI,in_RDI);
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::end
              (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (__normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
                        *)in_stack_ffffffffffffff48);
    if (bVar1) {
      in_stack_ffffffffffffff54 = (int)local_50 + 1;
      ptVar3 = __gnu_cxx::
               __normal_iterator<sqlite_orm::table_info_*,_std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>_>
               ::operator->(&local_60);
      ptVar3->pk = in_stack_ffffffffffffff54;
    }
    local_50 = (vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)
               ((long)&(local_50->
                       super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_11 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_48);
  if ((local_11 & 1) == 0) {
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::~vector(this_00);
  }
  return (vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)
         (table_info *)in_RDI.columnName;
}

Assistant:

std::vector<table_info> get_table_info() const {
        std::vector<table_info> res;
        res.reserve(size_t(this->columns_count));
        this->for_each_column([&res](auto &col) {
          std::string dft;
          using field_type = typename std::decay<decltype(col)>::type::field_type;
          if(auto d = col.default_value()) {
              dft = *d;
          }
          table_info i{
              -1,
              col.name,
              type_printer<field_type>().print(),
              col.not_null(),
              dft,
              col.template has<constraints::primary_key_t<>>(),
          };
          res.emplace_back(i);
        });
        auto compositeKeyColumnNames = this->composite_key_columns_names();
        for(size_t i = 0; i < compositeKeyColumnNames.size(); ++i) {
            auto &columnName = compositeKeyColumnNames[i];
            auto it = std::find_if(res.begin(), res.end(), [&columnName](const table_info &ti) {
              return ti.name == columnName;
            });
            if(it != res.end()) {
                it->pk = static_cast<int>(i + 1);
            }
        }
        return res;
    }